

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cc
# Opt level: O2

void avro::ensureType<std::__cxx11::string>(Entity *e,string *name)

{
  Exception *this;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  char *local_128;
  string local_120;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  
  if (e->type_ == etString) {
    return;
  }
  this = (Exception *)__cxa_allocate_exception(0x18);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
            (&local_100,"Json field \"%1%\" is not a %2%: %3%");
  pbVar1 = boost::io::detail::
           feed<char,std::char_traits<char>,std::allocator<char>,std::__cxx11::string_const&>
                     (&local_100,name);
  local_128 = "string";
  pbVar1 = boost::io::detail::
           feed<char,std::char_traits<char>,std::allocator<char>,char_const*const&>
                     (pbVar1,&local_128);
  json::Entity::toString_abi_cxx11_(&local_120,e);
  pbVar1 = boost::io::detail::
           feed<char,std::char_traits<char>,std::allocator<char>,std::__cxx11::string_const&>
                     (pbVar1,&local_120);
  Exception::Exception(this,pbVar1);
  __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void ensureType(const Entity& e, const string& name)
{
    if (e.type() != json::type_traits<T>::type()) {
        throw Exception(boost::format("Json field \"%1%\" is not a %2%: %3%") %
            name % json::type_traits<T>::name() % e.toString());
    }
}